

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::CopyingFileInputStream
          (CopyingFileInputStream *this,int file_descriptor)

{
  undefined4 in_ESI;
  CopyingInputStream *in_RDI;
  
  CopyingInputStream::CopyingInputStream(in_RDI);
  in_RDI->_vptr_CopyingInputStream = (_func_int **)&PTR__CopyingFileInputStream_008d7b50;
  *(undefined4 *)&in_RDI[1]._vptr_CopyingInputStream = in_ESI;
  *(undefined1 *)((long)&in_RDI[1]._vptr_CopyingInputStream + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_CopyingInputStream + 5) = 0;
  *(undefined4 *)&in_RDI[2]._vptr_CopyingInputStream = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CopyingInputStream + 4) = 0;
  return;
}

Assistant:

FileInputStream::CopyingFileInputStream::CopyingFileInputStream(
    int file_descriptor)
    : file_(file_descriptor),
      close_on_delete_(false),
      is_closed_(false),
      errno_(0),
      previous_seek_failed_(false) {}